

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall GlobOpt::PreparePropertySymForTypeCheckSeq(GlobOpt *this,PropertySym *propertySym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertySym *propertySym_local;
  GlobOpt *this_local;
  
  bVar2 = StackSym::IsTypeSpec(propertySym->m_stackSym);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x30e,"(!propertySym->m_stackSym->IsTypeSpec())",
                       "!propertySym->m_stackSym->IsTypeSpec()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  EnsureObjectTypeSym(this,propertySym->m_stackSym);
  EnsurePropertyWriteGuardSym(this,propertySym);
  return;
}

Assistant:

void
GlobOpt::PreparePropertySymForTypeCheckSeq(PropertySym *propertySym)
{
    Assert(!propertySym->m_stackSym->IsTypeSpec());
    EnsureObjectTypeSym(propertySym->m_stackSym);
    EnsurePropertyWriteGuardSym(propertySym);
}